

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_reserve_success_enoughCapacityBufferNotNull_fn(int _i)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  int line;
  char *pcVar5;
  char *pcVar6;
  ACUtilsGrowStrategy p_Var7;
  long lVar8;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 8;
  array.growStrategy = (ACUtilsGrowStrategy)0x0;
  array.capacity = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x10adb9;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  if (array.size != 1) {
    uVar2 = 0;
    do {
      array.buffer[uVar2] = '5';
      uVar2 = uVar2 + 1;
    } while (uVar2 < array.size - 1);
  }
  array.buffer[array.size - 1] = '0';
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  uStack_50 = 0x10ae10;
  bVar1 = private_ACUtils_ADynArray_reserve(&array,array.capacity,false,1);
  if (bVar1 == true) {
    uStack_50 = 0x10ae2a;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xca);
    if (array.size == 8) {
      uStack_50 = 0x10ae4a;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0xcb);
      if (array.capacity == 8) {
        uStack_50 = 0x10ae6a;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0xcc);
        if (array.buffer == (char *)0x0) {
          local_58 = 0;
          uStack_50 = 0;
          pcStack_60 = (char *)0x10b025;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0xcd,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x","(void*) array.buffer != NULL",
                            "(void*) array.buffer");
        }
        uStack_50 = 0x10ae8a;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0xcd);
        lVar8 = 0;
        do {
          p_Var7 = (ACUtilsGrowStrategy)(long)array.buffer[lVar8];
          if (p_Var7 != (ACUtilsGrowStrategy)0x35) {
            pcStack_60 = "\'5\'";
            pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
            pcVar5 = "array.buffer[i] == \'5\'";
            pcVar6 = "array.buffer[i]";
            line = 0xcf;
            local_58 = 0x35;
            goto LAB_0010af3d;
          }
          uStack_50 = 0x10aeaa;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0xcf);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        p_Var7 = (ACUtilsGrowStrategy)(long)array.buffer[7];
        if (p_Var7 == (ACUtilsGrowStrategy)0x30) {
          uStack_50 = 0x10aed8;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0xd0);
          if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
            uStack_50 = 0x10aef7;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0xd1);
            uStack_50 = 0x10af00;
            (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
            return;
          }
          expr = "Assertion \'_ck_x == NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar5 = "(void*) array.growStrategy == NULL";
          pcVar6 = "(void*) array.growStrategy";
          line = 0xd1;
          ppcVar4 = (char **)&uStack_50;
          p_Var7 = array.growStrategy;
          goto LAB_0010af3f;
        }
        pcStack_60 = "\'0\'";
        pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
        pcVar5 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'";
        pcVar6 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]";
        line = 0xd0;
        local_58 = 0x30;
        goto LAB_0010af3d;
      }
      pcVar5 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar6 = "array.capacity";
      line = 0xcc;
      p_Var7 = (ACUtilsGrowStrategy)array.capacity;
    }
    else {
      pcVar5 = "array.size == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar6 = "array.size";
      line = 0xcb;
      p_Var7 = (ACUtilsGrowStrategy)array.size;
    }
    pcStack_60 = "private_ACUtilsTest_ADynArray_capacityMin";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    local_58 = 8;
  }
  else {
    p_Var7 = (ACUtilsGrowStrategy)(ulong)bVar1;
    pcStack_60 = "true";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = 
    "private_ACUtils_ADynArray_reserve(&array, array.capacity, false, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar6 = 
    "private_ACUtils_ADynArray_reserve(&array, array.capacity, false, sizeof(*(&array)->buffer))";
    line = 0xca;
    local_58 = 1;
  }
LAB_0010af3d:
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  ppcVar4 = &pcStack_60;
LAB_0010af3f:
  uStack_50 = 0;
  *(ACUtilsGrowStrategy *)((long)ppcVar4 + -8) = p_Var7;
  *(undefined8 *)((long)ppcVar4 + -0x10) = 0x10af46;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,expr,pcVar3,pcVar5,pcVar6);
}

Assistant:

START_TEST(test_ADynArray_reserve_success_enoughCapacityBufferNotNull)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = nullptr;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, array.capacity), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NULL(array.growStrategy);
    array.deallocator(array.buffer);
}